

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall
spirv_cross::Compiler::ActiveBuiltinHandler::handle_builtin
          (ActiveBuiltinHandler *this,SPIRType *type,BuiltIn builtin,Bitset *decoration_flags)

{
  uint uVar1;
  CompilerError *this_00;
  
  if (builtin == BuiltInPosition) {
    if ((decoration_flags->lower & 0x40000) != 0) {
      this->compiler->position_invariant = true;
    }
    return;
  }
  if (builtin == BuiltInCullDistance) {
    if (*(type->array_size_literal).super_VectorView<bool>.ptr == false) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Array size for CullDistance must be a literal.");
    }
    else {
      uVar1 = *(type->array).super_VectorView<unsigned_int>.ptr;
      if (uVar1 != 0) {
        this->compiler->cull_distance_count = uVar1;
        return;
      }
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Array size for CullDistance must not be unsized.");
    }
  }
  else {
    if (builtin != BuiltInClipDistance) {
      return;
    }
    if (*(type->array_size_literal).super_VectorView<bool>.ptr == false) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Array size for ClipDistance must be a literal.");
    }
    else {
      uVar1 = *(type->array).super_VectorView<unsigned_int>.ptr;
      if (uVar1 != 0) {
        this->compiler->clip_distance_count = uVar1;
        return;
      }
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Array size for ClipDistance must not be unsized.");
    }
  }
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Compiler::ActiveBuiltinHandler::handle_builtin(const SPIRType &type, BuiltIn builtin,
                                                    const Bitset &decoration_flags)
{
	// If used, we will need to explicitly declare a new array size for these builtins.

	if (builtin == BuiltInClipDistance)
	{
		if (!type.array_size_literal[0])
			SPIRV_CROSS_THROW("Array size for ClipDistance must be a literal.");
		uint32_t array_size = type.array[0];
		if (array_size == 0)
			SPIRV_CROSS_THROW("Array size for ClipDistance must not be unsized.");
		compiler.clip_distance_count = array_size;
	}
	else if (builtin == BuiltInCullDistance)
	{
		if (!type.array_size_literal[0])
			SPIRV_CROSS_THROW("Array size for CullDistance must be a literal.");
		uint32_t array_size = type.array[0];
		if (array_size == 0)
			SPIRV_CROSS_THROW("Array size for CullDistance must not be unsized.");
		compiler.cull_distance_count = array_size;
	}
	else if (builtin == BuiltInPosition)
	{
		if (decoration_flags.get(DecorationInvariant))
			compiler.position_invariant = true;
	}
}